

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Const * __thiscall wasm::Builder::makeConst(Builder *this,Literal *value)

{
  Const *pCVar1;
  
  if ((value->type).id - 2 < 5) {
    pCVar1 = (Const *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
    (pCVar1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = ConstId;
    (pCVar1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
    (pCVar1->value).field_0.i64 = 0;
    (pCVar1->value).field_0.func.super_IString.str._M_str = (char *)0x0;
    (pCVar1->value).type.id = 0;
    wasm::Literal::operator=(&pCVar1->value,value);
    (pCVar1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id =
         (value->type).id;
    return pCVar1;
  }
  __assert_fail("value.type.isNumber()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x255,"Const *wasm::Builder::makeConst(Literal)");
}

Assistant:

Const* makeConst(Literal value) {
    assert(value.type.isNumber());
    auto* ret = wasm.allocator.alloc<Const>();
    ret->value = value;
    ret->type = value.type;
    return ret;
  }